

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::outputStyleBinary(Binasc *this,ostream *out,istream *input)

{
  byte bVar1;
  ulong uVar2;
  void *this_00;
  ostream *poVar3;
  byte local_2d;
  int local_2c;
  uchar ch;
  int currentByte;
  istream *input_local;
  ostream *out_local;
  Binasc *this_local;
  
  local_2c = 0;
  local_2d = std::istream::get();
  uVar2 = std::ios::eof();
  if ((uVar2 & 1) == 0) {
    while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
      if (local_2d < 0x10) {
        std::operator<<(out,'0');
      }
      this_00 = (void *)std::ostream::operator<<(out,std::hex);
      poVar3 = (ostream *)std::ostream::operator<<(this_00,(uint)local_2d);
      std::operator<<(poVar3,' ');
      local_2c = local_2c + 1;
      if (this->m_maxLineBytes <= local_2c) {
        std::operator<<(out,'\n');
        local_2c = 0;
      }
      local_2d = std::istream::get();
    }
    if (local_2c != 0) {
      std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    }
    this_local._4_4_ = 1;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"End of the file right away!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Binasc::outputStyleBinary(std::ostream& out, std::istream& input) {
	int currentByte = 0;    // current byte output in line
	uchar ch;               // current input byte

	ch = input.get();
	if (input.eof()) {
		std::cerr << "End of the file right away!" << std::endl;
		return 0;
	}

	while (!input.eof()) {
		if (ch < 0x10) {
			out << '0';
		}
		out << std::hex << (int)ch << ' ';
		currentByte++;
		if (currentByte >= m_maxLineBytes) {
			out << '\n';
			currentByte = 0;
		}
		ch = input.get();
	}

	if (currentByte != 0) {
		out << std::endl;
	}

	return 1;
}